

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall
glu::sl::ShaderParser::parseExpectResult(ShaderParser *this,ExpectResult *expectResult)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ExpectResult *local_18;
  ExpectResult *expectResult_local;
  ShaderParser *this_local;
  
  local_18 = expectResult;
  expectResult_local = (ExpectResult *)this;
  assumeToken(this,TOKEN_IDENTIFIER);
  bVar1 = std::operator==(&this->m_curTokenStr,"pass");
  if (bVar1) {
    *local_18 = EXPECT_PASS;
  }
  else {
    bVar1 = std::operator==(&this->m_curTokenStr,"compile_fail");
    if (bVar1) {
      *local_18 = EXPECT_COMPILE_FAIL;
    }
    else {
      bVar1 = std::operator==(&this->m_curTokenStr,"link_fail");
      if (bVar1) {
        *local_18 = EXPECT_LINK_FAIL;
      }
      else {
        bVar1 = std::operator==(&this->m_curTokenStr,"compile_or_link_fail");
        if (bVar1) {
          *local_18 = EXPECT_COMPILE_LINK_FAIL;
        }
        else {
          bVar1 = std::operator==(&this->m_curTokenStr,"validation_fail");
          if (bVar1) {
            *local_18 = EXPECT_VALIDATION_FAIL;
          }
          else {
            bVar1 = std::operator==(&this->m_curTokenStr,"build_successful");
            if (bVar1) {
              *local_18 = EXPECT_BUILD_SUCCESSFUL;
            }
            else {
              std::operator+(&local_38,"invalid expected result value: ",&this->m_curTokenStr);
              parseError(this,&local_38);
              std::__cxx11::string::~string((string *)&local_38);
            }
          }
        }
      }
    }
  }
  advanceToken(this);
  return;
}

Assistant:

void ShaderParser::parseExpectResult (ExpectResult& expectResult)
{
	assumeToken(TOKEN_IDENTIFIER);

	if (m_curTokenStr == "pass")
		expectResult = EXPECT_PASS;
	else if (m_curTokenStr == "compile_fail")
		expectResult = EXPECT_COMPILE_FAIL;
	else if (m_curTokenStr == "link_fail")
		expectResult = EXPECT_LINK_FAIL;
	else if (m_curTokenStr == "compile_or_link_fail")
		expectResult = EXPECT_COMPILE_LINK_FAIL;
	else if (m_curTokenStr == "validation_fail")
		expectResult = EXPECT_VALIDATION_FAIL;
	else if (m_curTokenStr == "build_successful")
		expectResult = EXPECT_BUILD_SUCCESSFUL;
	else
		parseError(string("invalid expected result value: " + m_curTokenStr));

	advanceToken();
}